

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteStmt.cpp
# Opt level: O2

string * __thiscall
hiberlite::SQLiteSelect::get_name_abi_cxx11_
          (string *__return_storage_ptr__,SQLiteSelect *this,int N)

{
  char *pcVar1;
  runtime_error *this_00;
  allocator local_11;
  
  if (this->active != false) {
    pcVar1 = sqlite3_column_name(((this->statement).res)->res->obj,N);
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_11);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"step() was not called before column access");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string SQLiteSelect::get_name(int N){
	if(!active)
		throw std::runtime_error("step() was not called before column access");
	return sqlite3_column_name(statement->get_stmt(), N);
}